

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmd_protocol.cc
# Opt level: O0

session * __thiscall helix::parity::pmd_protocol::new_session(pmd_protocol *this,void *data)

{
  session *psVar1;
  moldudp64_session<helix::parity::pmd_handler> *in_RSI;
  void *in_stack_ffffffffffffffe8;
  
  psVar1 = (session *)operator_new(0x118);
  nasdaq::moldudp64_session<helix::parity::pmd_handler>::moldudp64_session
            (in_RSI,in_stack_ffffffffffffffe8);
  return psVar1;
}

Assistant:

session* pmd_protocol::new_session(void *data)
{
    return new nasdaq::moldudp64_session<pmd_handler>(data);
}